

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O3

string * __thiscall
BackupRestaurant::toString_abi_cxx11_(string *__return_storage_ptr__,BackupRestaurant *this)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"backup ","");
  if ((this->super_BaseAction).status == ERROR) {
    pcVar1 = (this->super_BaseAction).errorMsg._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + (this->super_BaseAction).errorMsg._M_string_length
              );
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x10c196);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_58 = *plVar3;
      lStack_50 = plVar2[3];
      plVar4 = &local_58;
    }
    else {
      local_58 = *plVar3;
      plVar4 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar4);
    if (plVar4 != &local_58) {
      operator_delete(plVar4);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BackupRestaurant::toString() const
{
    std::string msg("backup ");
    if(getStatus() == ActionStatus::COMPLETED)
    {
        msg.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        msg.append("Error:" + getErrorMsg());
    }
    else msg.append("Pending");
    return msg;
}